

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void Game::cardRules(Player *player,int cardInt)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  Dice *pDVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  key_type local_4c;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_48;
  
  switch(cardInt) {
  case 0:
    pDVar4 = Player::getDice(player);
    Dice::getLastResolvedHand
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &local_48,pDVar4);
    local_4c = 5;
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_48,&local_4c);
    iVar1 = *pmVar5;
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_48);
    if (iVar1 < 3) {
      poVar2 = (ostream *)&std::cout;
      pcVar6 = "Cannot take this card, must roll atleast 3 Ouch!";
    }
    else {
      Player::addVictoryPoints(player,3);
      poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar3 = Player::getPlayerName_abi_cxx11_(player);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      pcVar6 = " added 3 victory points";
    }
    break;
  case 1:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    goto switchD_001103e0_caseD_1;
  case 2:
    pDVar4 = Player::getDice(player);
    Dice::getLastResolvedHand
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &local_48,pDVar4);
    local_4c = 0;
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_48,&local_4c);
    iVar1 = *pmVar5;
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_48);
    if (iVar1 < 1) {
      return;
    }
    Player::removeEnergyCubes(player,1);
    poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar3 = Player::getPlayerName_abi_cxx11_(player);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    pcVar6 = " removed 1 energy cube";
    break;
  case 3:
    Player::removeLifePoints(player,4);
    poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar3 = Player::getPlayerName_abi_cxx11_(player);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    pcVar6 = " took 4 damage";
    goto LAB_001105e2;
  case 9:
    iVar1 = Player::getZone(player);
    if ((0 < iVar1) && (iVar1 = Player::getZone(player), iVar1 < 7)) {
      Player::addEnergyCubes(player,1);
      poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar3 = Player::getPlayerName_abi_cxx11_(player);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      poVar2 = std::operator<<(poVar2," added 1 energy cube because he is in Manhattan");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    Player::addVictoryPoints(player,2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar3 = Player::getPlayerName_abi_cxx11_(player);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    pcVar6 = " added 2 victory pts";
LAB_001105e2:
    poVar2 = std::operator<<(poVar2,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  default:
    if (cardInt == 0x12) {
      iVar1 = Player::getZone(player);
      if (iVar1 == 10) {
        Player::addEnergyCubes(player,1);
        poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
        psVar3 = Player::getPlayerName_abi_cxx11_(player);
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        poVar2 = std::operator<<(poVar2," added 1 energy cube because he is in Brooklyn");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      Player::addVictoryPoints(player,3);
      poVar2 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar3 = Player::getPlayerName_abi_cxx11_(player);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      pcVar6 = " added 3 victory pts";
      goto LAB_001105e2;
    }
    goto switchD_001103e0_caseD_1;
  }
  poVar2 = std::operator<<(poVar2,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar2);
switchD_001103e0_caseD_1:
  return;
}

Assistant:

void Game::cardRules(Player* player, int cardInt) {
    // 0= "Energy", 1="Attack", 2="Destruction", 3="Heal", 4="Celebrity", 5="Ouch"

    switch(cardInt){
        case 0:
            if(player->getDice()->getLastResolvedHand()[5]> 2){
                player->addVictoryPoints(3);
                cout << "Player : " << player->getPlayerName() << " added 3 victory points" << endl;

            }
            else{
                cout << "Cannot take this card, must roll atleast 3 Ouch!" << endl;
            }
            break;
        case 1:

            break;
        case 2:
            if(player->getDice()->getLastResolvedHand()[0]>0){
                player->removeEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " removed 1 energy cube" << endl;

            }
            break;
        case 3:
            player->removeLifePoints(4);
            cout << "Player : " << player->getPlayerName() << " took 4 damage" << endl;
            break;
        case 4:

            break;
        case 5:

            break;
        case 6:

            break;
        case 7:

            break;
        case 8:

            break;
        case 9:
            if(player->getZone() > 0 && player->getZone() < 7){
                player->addEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " added 1 energy cube because he is in Manhattan" << endl;
            }
            player->addVictoryPoints(2);
            cout << "Player : " << player->getPlayerName() << " added 2 victory pts" << endl;
            break;
        case 18:
            if(player->getZone() ==10) {
                player->addEnergyCubes(1);
                cout << "Player : " << player->getPlayerName() << " added 1 energy cube because he is in Brooklyn" << endl;

            }
            player->addVictoryPoints(3);
            cout << "Player : " << player->getPlayerName() << " added 3 victory pts" << endl;
            break;
        default:
            break;
    }


}